

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O0

bool __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>_>
::MainState::operator!=(MainState *this,MainState *rhs)

{
  bool local_19;
  MainState *rhs_local;
  MainState *this_local;
  
  local_19 = true;
  if ((((((this->base).read & 1U) == ((rhs->base).read & 1U)) &&
       (local_19 = true, ((this->base).write & 1U) == ((rhs->base).write & 1U))) &&
      (local_19 = true, ((this->region_04_08).read & 1U) == ((rhs->region_04_08).read & 1U))) &&
     ((local_19 = true, ((this->region_04_08).write & 1U) == ((rhs->region_04_08).write & 1U) &&
      (local_19 = true, ((this->region_20_40).read & 1U) == ((rhs->region_20_40).read & 1U))))) {
    local_19 = ((this->region_20_40).write & 1U) != ((rhs->region_20_40).write & 1U);
  }
  return local_19;
}

Assistant:

bool operator != (const MainState &rhs) const {
				return
					base.read != rhs.base.read || base.write != rhs.base.write ||
					region_04_08.read != rhs.region_04_08.read || region_04_08.write != rhs.region_04_08.write ||
					region_20_40.read != rhs.region_20_40.read || region_20_40.write != rhs.region_20_40.write;
			}